

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.h
# Opt level: O0

void __thiscall ReaderData::ReaderData(ReaderData *this)

{
  ReaderData *this_local;
  
  this->_vptr_ReaderData = (_func_int **)&PTR__ReaderData_00440228;
  this->m_bufferIndex = '\0';
  this->m_notified = false;
  this->m_nextBlockSize = 0;
  this->m_deleted = false;
  this->m_firstBlock = false;
  this->m_lastBlock = false;
  this->m_eof = false;
  this->m_atQueue = 0;
  this->itr = (FileNameIterator *)0x0;
  this->m_blockSize = 0;
  this->m_allocSize = 0;
  std::__cxx11::string::string((string *)&this->m_streamName);
  this->m_readOffset = 0;
  this->m_nextBlock[0] = (uint8_t *)0x0;
  this->m_nextBlock[1] = (uint8_t *)0x0;
  return;
}

Assistant:

ReaderData()
        : m_bufferIndex(0),
          m_notified(false),
          m_nextBlockSize(0),
          m_deleted(false),
          m_firstBlock(false),
          m_lastBlock(false),
          m_eof(false),
          m_atQueue(0),
          itr(nullptr),
          m_blockSize(0),
          m_allocSize(0),
          m_readOffset(0)
    {
        m_nextBlock[0] = nullptr;
        m_nextBlock[1] = nullptr;
    }